

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O1

Function * dxil_spv::get_entry_point_function(MDNode *node)

{
  MetadataKind MVar1;
  ValueKind VVar2;
  ConstantAsMetadata *this;
  Constant *value;
  Function *this_00;
  LoggingCallback p_Var3;
  void *pvVar4;
  char acStack_1018 [4104];
  
  if (node != (MDNode *)0x0) {
    this = (ConstantAsMetadata *)LLVMBC::MDNode::getOperand(node,0);
    if ((this->super_MDOperand).kind == None) {
      return (Function *)0x0;
    }
    MVar1 = LLVMBC::MDOperand::get_metadata_kind((MDOperand *)this);
    if (MVar1 != Constant) {
      p_Var3 = get_thread_log_callback();
      if (p_Var3 == (LoggingCallback)0x0) {
        get_entry_point_function();
        std::terminate();
      }
      builtin_strncpy(acStack_1018 + 0x10,"in cast<T>.\n",0xd);
      builtin_strncpy(acStack_1018,"Invalid type ID ",0x10);
      pvVar4 = get_thread_log_callback_userdata();
      (*p_Var3)(pvVar4,Error,acStack_1018);
      std::terminate();
    }
    value = LLVMBC::ConstantAsMetadata::getValue(this);
    if (value != (Constant *)0x0) {
      this_00 = (Function *)LLVMBC::Internal::resolve_proxy(&value->super_Value);
      VVar2 = LLVMBC::Value::get_value_kind((Value *)this_00);
      if (VVar2 != Function) {
        return (Function *)0x0;
      }
      return this_00;
    }
  }
  return (Function *)0x0;
}

Assistant:

static llvm::Function *get_entry_point_function(llvm::MDNode *node)
{
	if (!node)
		return nullptr;

	auto &func_node = node->getOperand(0);

	if (func_node)
		return llvm::dyn_cast<llvm::Function>(llvm::cast<llvm::ConstantAsMetadata>(func_node)->getValue());
	else
		return nullptr;
}